

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O0

int gost2015_set_asn1_params(ASN1_TYPE *params,uchar *iv,size_t iv_size,uchar *kdf_seed)

{
  int iVar1;
  GOST2015_CIPHER_PARAMS *pGVar2;
  undefined8 *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  ASN1_TYPE *in_RDI;
  uchar *buf;
  uchar ukm_buf [16];
  ASN1_OCTET_STRING *os;
  int len;
  int ret;
  GOST2015_CIPHER_PARAMS *gcp;
  char *in_stack_ffffffffffffff98;
  GOST2015_CIPHER_PARAMS *a;
  uchar **in_stack_ffffffffffffffa8;
  GOST2015_CIPHER_PARAMS *in_stack_ffffffffffffffb0;
  ASN1_OCTET_STRING *local_40;
  int local_34;
  int local_4;
  
  pGVar2 = GOST2015_CIPHER_PARAMS_new();
  local_34 = 0;
  local_40 = (ASN1_OCTET_STRING *)0x0;
  a = (GOST2015_CIPHER_PARAMS *)0x0;
  if (pGVar2 == (GOST2015_CIPHER_PARAMS *)0x0) {
    ERR_GOST_error(0,0,in_stack_ffffffffffffff98,0);
    local_4 = 0;
  }
  else {
    memcpy(&stack0xffffffffffffffa8,in_RSI,in_RDX);
    *(undefined8 *)(&stack0xffffffffffffffa8 + in_RDX) = *in_RCX;
    iVar1 = ASN1_STRING_set((ASN1_STRING *)pGVar2->ukm,&stack0xffffffffffffffa8,(int)in_RDX + 8);
    if (iVar1 == 0) {
      ERR_GOST_error((int)((ulong)a >> 0x20),(int)a,in_stack_ffffffffffffff98,0);
    }
    else {
      iVar1 = i2d_GOST2015_CIPHER_PARAMS(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (((0 < iVar1) && (local_40 = ASN1_OCTET_STRING_new(), local_40 != (ASN1_OCTET_STRING *)0x0)
          ) && (iVar1 = ASN1_OCTET_STRING_set(local_40,(uchar *)a,iVar1), iVar1 != 0)) {
        ASN1_TYPE_set(in_RDI,0x10,local_40);
        local_34 = 1;
      }
    }
    CRYPTO_free(a);
    if ((local_34 == 0) && (local_40 != (ASN1_OCTET_STRING *)0x0)) {
      ASN1_OCTET_STRING_free(local_40);
    }
    GOST2015_CIPHER_PARAMS_free(a);
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

int gost2015_set_asn1_params(ASN1_TYPE *params,
    const unsigned char *iv, size_t iv_size, const unsigned char *kdf_seed)
{
    GOST2015_CIPHER_PARAMS *gcp = GOST2015_CIPHER_PARAMS_new();
    int ret = 0, len = 0;

    ASN1_OCTET_STRING *os = NULL;
    unsigned char ukm_buf[MAX_GOST2015_UKM_SIZE];
    unsigned char *buf = NULL;

    if (gcp == NULL) {
        GOSTerr(GOST_F_GOST2015_SET_ASN1_PARAMS, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    memcpy(ukm_buf, iv, iv_size);
    memcpy(ukm_buf+iv_size, kdf_seed, KDF_SEED_SIZE);

    if (ASN1_STRING_set(gcp->ukm, ukm_buf, iv_size + KDF_SEED_SIZE) == 0) {
        GOSTerr(GOST_F_GOST2015_SET_ASN1_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    len = i2d_GOST2015_CIPHER_PARAMS(gcp, &buf);

    if (len <= 0
       || (os = ASN1_OCTET_STRING_new()) == NULL
       || ASN1_OCTET_STRING_set(os, buf, len) == 0) {
        goto end;
  }

    ASN1_TYPE_set(params, V_ASN1_SEQUENCE, os);
    ret = 1;

end:
    OPENSSL_free(buf);
    if (ret <= 0 && os)
        ASN1_OCTET_STRING_free(os);

    GOST2015_CIPHER_PARAMS_free(gcp);
    return ret;
}